

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

ostream * doctest::detail::getTlsOss(void)

{
  ostream *poVar1;
  long lVar2;
  long *in_FS_OFFSET;
  long *local_40 [2];
  long local_30 [2];
  
  g_infoContexts::__tls_init();
  lVar2 = *in_FS_OFFSET;
  poVar1 = (ostream *)(lVar2 + -0x1d8);
  std::ios::clear((int)*(undefined8 *)(in_FS_OFFSET[-0x3b] + -0x18) + (int)poVar1);
  g_infoContexts::__tls_init();
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  std::__cxx11::stringbuf::str((string *)(lVar2 + -0x1d0));
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  g_infoContexts::__tls_init();
  return poVar1;
}

Assistant:

std::ostream* getTlsOss() {
        g_oss.clear(); // there shouldn't be anything worth clearing in the flags
        g_oss.str(""); // the slow way of resetting a string stream
        //g_oss.seekp(0); // optimal reset - as seen here: https://stackoverflow.com/a/624291/3162383
        return &g_oss;
    }